

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test::TestBody
          (NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *pMVar2;
  ForeignMessage *pFVar3;
  char *pcVar4;
  char *in_R9;
  _Head_base<0UL,_unsigned_long,_false> in_stack_fffffffffffffd60;
  string local_220;
  AssertHelper local_200;
  Message local_1f8;
  key_arg<int> local_1f0;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_;
  Message local_1d0;
  no_presence_map_test_internal local_1c8 [8];
  char local_1c0 [8];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_3;
  Message local_1a0;
  char local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  char local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message *msg_map_entry;
  Message local_148;
  int local_140 [2];
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  string_view local_120;
  FieldDescriptor *local_110;
  FieldDescriptor *field_map_int32_foreign_message;
  Descriptor *desc;
  Reflection *local_f0;
  Reflection *r;
  TestAllMapTypes message;
  NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test *this_local;
  
  message.field_0._192_8_ = this;
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes((TestAllMapTypes *)&r);
  local_f0 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetReflection();
  this_00 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetDescriptor();
  field_map_int32_foreign_message = (FieldDescriptor *)this_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,"map_int32_foreign_message");
  local_110 = Descriptor::FindFieldByName(this_00,local_120);
  pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::mutable_map_int32_foreign_message
                     ((TestAllMapTypes *)&r);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x7b;
  pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::operator[]<int>
                     (pMVar2,(key_arg<int> *)
                             ((long)&gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 4));
  proto2_nofieldpresence_unittest::ForeignMessage::set_c(pFVar3,0x2775);
  local_140[1] = 1;
  local_140[0] = Reflection::FieldSize(local_f0,(Message *)&r,local_110);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_138,"1","r->FieldSize(message, field_map_int32_foreign_message)",
             local_140 + 1,local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&msg_map_entry,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x185,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&msg_map_entry,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg_map_entry);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Reflection::GetRepeatedMessage(local_f0,(Message *)&r,local_110,0);
  MapEntryHasKey();
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>::
  operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasKeyMatcher>
              *)local_168,&local_169,(Message *)0x1dc5ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x18a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  MapEntryHasValue();
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>::
  operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryHasValueMatcher>
              *)local_190,&local_191,(Message *)0x1dc5ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x18b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  no_presence_map_test_internal::MapEntryListFieldsSize<unsigned_long>(local_1c8,2);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::no_presence_map_test_internal::MapEntryListFieldsSizeMatcherP<unsigned_long>>
            ((MapEntryListFieldsSizeMatcherP<unsigned_long>)in_stack_fffffffffffffd60._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::no_presence_map_test_internal::MapEntryListFieldsSizeMatcherP<unsigned_long>>
  ::operator()(local_1b8,local_1c0,(Message *)0x1dc5ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x18c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  pMVar2 = proto2_nofieldpresence_unittest::TestAllMapTypes::map_int32_foreign_message
                     ((TestAllMapTypes *)&r);
  local_1f0 = 0x7b;
  pFVar3 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>(pMVar2,&local_1f0);
  local_1e9 = MapValueSubMessageHasFieldViaReflection(&pFVar3->super_Message);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_220,(internal *)local_1e8,
               (AssertionResult *)
               "MapValueSubMessageHasFieldViaReflection( message.map_int32_foreign_message().at(123))"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x191,pcVar4);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)&r);
  return;
}

Assistant:

TEST(NoFieldPresenceTest,
     TestNonZeroSubMessageMapEntriesPopulatedInReflection) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_message =
      desc->FindFieldByName("map_int32_foreign_message");

  (*message.mutable_map_int32_foreign_message())[123].set_c(10101);

  // Map entries show up on reflection.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_foreign_message));
  const google::protobuf::Message& msg_map_entry = r->GetRepeatedMessage(
      message, field_map_int32_foreign_message, /*index=*/0);

  // HasField for both key and value returns true.
  EXPECT_THAT(msg_map_entry, MapEntryHasKey());
  EXPECT_THAT(msg_map_entry, MapEntryHasValue());
  EXPECT_THAT(msg_map_entry, MapEntryListFieldsSize(2));

  // For value types that are messages, further test that the message fields
  // show up on reflection.
  EXPECT_TRUE(MapValueSubMessageHasFieldViaReflection(
      message.map_int32_foreign_message().at(123)));
}